

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_667a22::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value_00;
  char *pcVar1;
  pointer pbVar2;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmMakefile *pcVar7;
  reference pvVar8;
  unsigned_long local_208;
  cmAlphaNum local_200;
  cmAlphaNum local_1d0;
  string local_1a0;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  int local_fc;
  size_type sStack_f8;
  int item;
  size_t nitem;
  char *sep;
  size_t cc;
  string value;
  string local_b8;
  undefined4 local_94;
  string_view local_90;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string *variableName;
  string *listName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar3 = local_20;
  if (sVar5 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command GET requires at least three arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)status_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80);
    pcVar7 = cmExecutionStatus::GetMakefile(local_20);
    bVar4 = GetList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80,pvVar6,pcVar7);
    if (bVar4) {
      bVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
      pcVar3 = local_20;
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"GET given empty list",
                   (allocator<char> *)(value.field_2._M_local_buf + 0xf));
        cmExecutionStatus::SetError(pcVar3,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
        args_local._7_1_ = 0;
        local_94 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&cc);
        nitem = (long)"PK\x01\x02" + 4;
        sStack_f8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_80);
        sep = (char *)0x2;
        while( true ) {
          pcVar1 = sep;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          if ((char *)(sVar5 - 1) <= pcVar1) break;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(size_type)sep);
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          bVar4 = GetIndexArg(pvVar6,&local_fc,pcVar7);
          pcVar3 = local_20;
          if (!bVar4) {
            cmAlphaNum::cmAlphaNum(&local_150,"index: ");
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(size_type)sep);
            cmAlphaNum::cmAlphaNum(&local_180,pvVar6);
            cmStrCat<char[22]>(&local_120,&local_150,&local_180,
                               (char (*) [22])" is not a valid index");
            cmExecutionStatus::SetError(pcVar3,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            args_local._7_1_ = 0;
            goto LAB_0042f26f;
          }
          std::__cxx11::string::operator+=((string *)&cc,(char *)nitem);
          pcVar3 = local_20;
          nitem = (long)"^date: +([^;]+); +author: +([^;]+);" + 0x22;
          if (local_fc < 0) {
            local_fc = (int)sStack_f8 + local_fc;
          }
          if ((local_fc < 0) || (sStack_f8 <= (ulong)(long)local_fc)) {
            cmAlphaNum::cmAlphaNum(&local_1d0,"index: ");
            cmAlphaNum::cmAlphaNum(&local_200,local_fc);
            local_208 = sStack_f8 - 1;
            cmStrCat<char[17],unsigned_long,char[3],unsigned_long,char[2]>
                      (&local_1a0,&local_1d0,&local_200,(char (*) [17])" out of range (-",
                       &stack0xffffffffffffff08,(char (*) [3])0xdc3e89,&local_208,
                       (char (*) [2])0xdefdca);
            cmExecutionStatus::SetError(pcVar3,&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            args_local._7_1_ = 0;
            goto LAB_0042f26f;
          }
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_80,(long)local_fc);
          std::__cxx11::string::operator+=((string *)&cc,(string *)pvVar8);
          sep = sep + 1;
        }
        pcVar7 = cmExecutionStatus::GetMakefile(local_20);
        pbVar2 = varArgsExpanded.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        value_00 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&cc);
        cmMakefile::AddDefinition(pcVar7,pbVar2,value_00);
        args_local._7_1_ = 1;
LAB_0042f26f:
        local_94 = 1;
        std::__cxx11::string::~string((string *)&cc);
      }
    }
    else {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      pbVar2 = varArgsExpanded.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"NOTFOUND")
      ;
      cmMakefile::AddDefinition(pcVar7,pbVar2,local_90);
      args_local._7_1_ = 1;
      local_94 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<cm::string_view,
                  std::function<cmCMakePath(const cmCMakePath&, bool)>> const
    actions{ { "ROOT_NAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootName();
               } },
             { "ROOT_DIRECTORY"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootDirectory();
               } },
             { "ROOT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootPath();
               } },
             { "FILENAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetFileName();
               } },
             { "EXTENSION"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetExtension();
                 }
                 return path.GetWideExtension();
               } },
             { "STEM"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetStem();
                 }
                 return path.GetNarrowStem();
               } },
             { "RELATIVE_PART"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRelativePath();
               } },
             { "PARENT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetParentPath();
               } } };

  if (args.size() < 4) {
    status.SetError("GET must be called with at least three arguments.");
    return false;
  }

  const auto& action = args[2];

  if (actions.find(action) == actions.end()) {
    status.SetError(
      cmStrCat("GET called with an unknown action: ", action, "."));
    return false;
  }

  struct Arguments
  {
    bool LastOnly = false;
  };

  CMakePathArgumentParser<Arguments> parser;
  if ((action == "EXTENSION"_s || action == "STEM"_s)) {
    parser.Bind("LAST_ONLY"_s, &Arguments::LastOnly);
  }

  Arguments const arguments = parser.Parse<3>(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("GET called with unexpected arguments.");
    return false;
  }
  if (parser.GetInputs().front().empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  std::string path;
  if (!getInputPath(args[1], status, path)) {
    return false;
  }

  auto result = actions.at(action)(path, arguments.LastOnly);

  status.GetMakefile().AddDefinition(parser.GetInputs().front(),
                                     result.String());

  return true;
}